

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  uint uVar2;
  i64 iVar3;
  Wal *pWal;
  u32 *puVar4;
  _func_int_sqlite3_file_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  u32 uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint *p;
  u32 uVar14;
  PgHdr **ppPVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  u32 uVar20;
  long lVar21;
  sqlite3_backup *p_00;
  long lVar22;
  PgHdr *pPVar23;
  PgHdr *pPVar24;
  long in_FS_OFFSET;
  bool bVar25;
  WalWriter w;
  u32 salt1;
  PgHdr *local_b0;
  PgHdr *local_98;
  sqlite3_file *local_90;
  uint *local_88;
  long local_80;
  WalWriter local_78;
  ulong local_58;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  undefined8 local_48;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = pList;
  if (isCommit == 0) {
    iVar7 = 1;
  }
  else {
    iVar7 = 0;
    ppPVar15 = &local_98;
    do {
      if (pList->pgno <= nTruncate) {
        ppPVar15 = &pList->pDirty;
      }
      iVar7 = iVar7 + (uint)(pList->pgno <= nTruncate);
      pList = pList->pDirty;
      *ppPVar15 = pList;
    } while (pList != (PgHdr *)0x0);
  }
  pPVar23 = local_98;
  pPager->aStat[2] = pPager->aStat[2] + iVar7;
  if (local_98->pgno == 1) {
    pager_write_changecounter(local_98);
  }
  iVar3 = pPager->pageSize;
  pWal = pPager->pWal;
  bVar1 = pPager->walSyncFlags;
  uVar8 = (uint)bVar1;
  puVar4 = *pWal->apWiData;
  iVar7 = bcmp(&pWal->hdr,puVar4,0x30);
  if (iVar7 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = puVar4[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar4[0x18] == 0) {
LAB_0012b15c:
      if (pWal->exclusiveMode == '\0') {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
      }
      pWal->readLock = -1;
      iVar12 = 1;
      do {
        iVar7 = walTryBeginRead(pWal,(int *)&local_58,1,iVar12);
        iVar12 = iVar12 + 1;
      } while (iVar7 == -1);
    }
    else {
      sqlite3_randomness(4,&local_58);
      if (pWal->exclusiveMode != '\0') {
LAB_0012ae13:
        walRestartHdr(pWal,(uint)local_58);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
        goto LAB_0012b15c;
      }
      iVar7 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      if (iVar7 == 5) goto LAB_0012b15c;
      if (iVar7 == 0) goto LAB_0012ae13;
    }
    if (iVar7 != 0) goto LAB_0012b39c;
  }
  uVar19 = (pWal->hdr).mxFrame;
  uVar18 = (ulong)uVar19;
  uVar20 = (u32)iVar3;
  if (uVar18 == 0) {
    local_58 = 0x18e22d0082067f37;
    local_50 = (char)((ulong)iVar3 >> 0x18);
    local_4f = (char)((ulong)iVar3 >> 0x10);
    local_4e = (char)((ulong)iVar3 >> 8);
    local_4d = (char)iVar3;
    uVar11 = pWal->nCkpt;
    local_4c = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    if (uVar11 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_48 = *(undefined8 *)(pWal->hdr).aSalt;
    uVar10 = 0;
    uVar16 = 0xfffffffffffffff8;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + uVar10 + *(int *)(&local_50 + uVar16);
      uVar10 = uVar10 + *(int *)((long)&local_4c + uVar16) + uVar14;
      uVar16 = uVar16 + 8;
    } while (uVar16 < 0x10);
    local_40 = (undefined1)(uVar14 >> 0x18);
    local_3f = (undefined1)(uVar14 >> 0x10);
    local_3e = (undefined1)(uVar14 >> 8);
    local_3d = (undefined1)uVar14;
    local_3c = (undefined1)(uVar10 >> 0x18);
    local_3b = (undefined1)(uVar10 >> 0x10);
    local_3a = (undefined1)(uVar10 >> 8);
    local_39 = (undefined1)uVar10;
    pWal->szPage = uVar20;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar14;
    (pWal->hdr).aFrameCksum[1] = uVar10;
    pWal->truncateOnCommit = '\x01';
    iVar7 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_58,0x20,0);
    if ((iVar7 != 0) ||
       (((pWal->syncHeader != '\0' && ((bVar1 >> 2 & 3) != 0)) &&
        (iVar7 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,bVar1 >> 2 & 3), iVar7 != 0))))
    goto LAB_0012b39c;
  }
  local_90 = pWal->pWalFd;
  local_78.iSyncPoint = 0;
  lVar13 = (long)(int)(uVar20 + 0x18);
  lVar22 = uVar18 * lVar13 + 0x20;
  iVar12 = 0;
  local_78.pWal = pWal;
  local_78.pFd = local_90;
  local_78.syncFlags = uVar8;
  local_78.szPage = uVar20;
  if (pPVar23 == (PgHdr *)0x0) {
    local_b0 = (PgHdr *)0x0;
  }
  else {
    local_b0 = (PgHdr *)0x0;
    pPVar24 = pPVar23;
    do {
      if (uVar9 == 0) {
LAB_0012ad3c:
        if (isCommit == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = 0;
          if (pPVar24->pDirty == (PgHdr *)0x0) {
            uVar16 = (ulong)nTruncate;
          }
        }
LAB_0012ad56:
        iVar7 = walWriteOneFrame(&local_78,(PgHdr *)pPVar24->pData,pPVar24->pgno,uVar16);
        if (iVar7 != 0) goto LAB_0012b39c;
        uVar18 = (ulong)((int)uVar18 + 1);
        lVar22 = lVar22 + lVar13;
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags | 0x40;
        local_b0 = pPVar24;
      }
      else {
        if ((isCommit != 0) && (uVar16 = (ulong)nTruncate, pPVar24->pDirty == (PgHdr *)0x0))
        goto LAB_0012ad56;
        local_58 = local_58 & 0xffffffff00000000;
        sqlite3WalFindFrame(pWal,pPVar24->pgno,(u32 *)&local_58);
        if ((uint)local_58 < uVar9) goto LAB_0012ad3c;
        if ((uint)local_58 <= pWal->iReCksum - 1) {
          pWal->iReCksum = (uint)local_58;
        }
        iVar7 = (*pWal->pWalFd->pMethods->xWrite)
                          (pWal->pWalFd,pPVar24->pData,uVar20,
                           (ulong)((uint)local_58 - 1) * lVar13 + 0x38);
        if (iVar7 != 0) goto LAB_0012b39c;
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags & 0xbf;
      }
      uVar19 = (uint)uVar18;
      pPVar24 = pPVar24->pDirty;
    } while (pPVar24 != (PgHdr *)0x0);
  }
  uVar9 = 0;
  if (isCommit != 0) {
    if (pWal->iReCksum != 0) {
      lVar21 = (long)(int)pWal->szPage + 0x18;
      iVar12 = (int)lVar21;
      p = (uint *)sqlite3_malloc(iVar12);
      if (p == (uint *)0x0) {
        iVar7 = 7;
        goto LAB_0012b39c;
      }
      lVar17 = 0x18;
      if (pWal->iReCksum != 1) {
        lVar17 = (ulong)(pWal->iReCksum - 2) * lVar21 + 0x30;
      }
      iVar7 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar17);
      uVar9 = *p;
      (pWal->hdr).aFrameCksum[0] =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar9 = p[1];
      (pWal->hdr).aFrameCksum[1] =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      uVar9 = pWal->iReCksum;
      pWal->iReCksum = 0;
      if (uVar9 <= uVar19 && iVar7 == 0) {
        local_80 = (long)iVar12;
        local_88 = p + 6;
        do {
          lVar21 = (ulong)(uVar9 - 1) * local_80 + 0x20;
          iVar7 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar12,lVar21);
          if (iVar7 != 0) {
            sqlite3_free(p);
            goto LAB_0012b39c;
          }
          uVar11 = *p;
          uVar2 = p[1];
          walEncodeFrame(pWal,uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                              uVar11 << 0x18,
                         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18,(u8 *)local_88,(u8 *)&local_58);
          iVar7 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_58,0x18,lVar21);
        } while ((uVar9 + 1 <= uVar19) && (uVar9 = uVar9 + 1, iVar7 == 0));
      }
      sqlite3_free(p);
      if (iVar7 != 0) goto LAB_0012b39c;
    }
    if ((bVar1 & 3) == 0) {
      iVar12 = 0;
      uVar9 = 0;
    }
    else {
      if (pWal->padToSectorBoundary == '\0') {
        uVar9 = 0;
      }
      else {
        p_Var5 = pWal->pWalFd->pMethods->xSectorSize;
        if (p_Var5 == (_func_int_sqlite3_file_ptr *)0x0) {
          uVar18 = 0x1000;
        }
        else {
          uVar11 = (*p_Var5)(pWal->pWalFd);
          uVar9 = 0x10000;
          if (uVar11 < 0x10000) {
            uVar9 = uVar11;
          }
          uVar18 = 0x200;
          if (0x1f < (int)uVar11) {
            uVar18 = (ulong)uVar9;
          }
        }
        lVar21 = uVar18 + lVar22 + -1;
        lVar21 = lVar21 - lVar21 % (long)uVar18;
        iVar12 = 0;
        uVar9 = 0;
        local_78.iSyncPoint = lVar21;
        if (lVar22 < lVar21) {
          uVar9 = 0;
          lVar17 = lVar22;
          do {
            iVar7 = walWriteOneFrame(&local_78,(PgHdr *)local_b0->pData,local_b0->pgno,
                                     (ulong)nTruncate);
            if (iVar7 != 0) goto LAB_0012b39c;
            lVar17 = lVar17 + lVar13;
            uVar9 = uVar9 + 1;
          } while (lVar17 < lVar21);
        }
        if (lVar21 != lVar22) goto LAB_0012b272;
      }
      iVar12 = (*local_90->pMethods->xSync)(local_90,uVar8 & 3);
    }
LAB_0012b272:
    if ((pWal->truncateOnCommit != '\0') && (lVar22 = pWal->mxWalSize, -1 < lVar22)) {
      lVar13 = lVar13 * (ulong)(uVar19 + uVar9) + 0x20;
      if (lVar13 <= lVar22) {
        lVar13 = lVar22;
      }
      walLimitSize(pWal,lVar13);
      pWal->truncateOnCommit = '\0';
    }
  }
  uVar20 = (pWal->hdr).mxFrame;
  iVar7 = iVar12;
  pPVar24 = pPVar23;
  while ((pPVar24 != (PgHdr *)0x0 && (iVar7 == 0))) {
    iVar7 = 0;
    if ((pPVar24->flags & 0x40) != 0) {
      uVar20 = uVar20 + 1;
      iVar7 = walIndexAppend(pWal,uVar20,pPVar24->pgno);
    }
    pPVar24 = pPVar24->pDirty;
  }
  bVar25 = iVar7 == 0;
  if ((bVar25) && (0 < (int)uVar9)) {
    do {
      uVar20 = uVar20 + 1;
      iVar7 = walIndexAppend(pWal,uVar20,local_b0->pgno);
      bVar25 = iVar7 == 0;
      if (!bVar25) break;
      bVar6 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar6);
  }
  if (bVar25) {
    (pWal->hdr).szPage = (ushort)((ulong)iVar3 >> 0x10) | (ushort)iVar3 & 0xff00;
    (pWal->hdr).mxFrame = uVar20;
    if (isCommit != 0) {
      puVar4 = &(pWal->hdr).iChange;
      *puVar4 = *puVar4 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar20;
    }
  }
  else if (iVar7 != 0) goto LAB_0012b39c;
  p_00 = pPager->pBackup;
  iVar7 = 0;
  if (p_00 != (sqlite3_backup *)0x0 && pPVar23 != (PgHdr *)0x0) {
    while( true ) {
      if (p_00 != (sqlite3_backup *)0x0) {
        backupUpdate(p_00,pPVar23->pgno,(u8 *)pPVar23->pData);
      }
      pPVar23 = pPVar23->pDirty;
      if (pPVar23 == (PgHdr *)0x0) break;
      p_00 = pPager->pBackup;
    }
  }
LAB_0012b39c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal,
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}